

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O2

int main(void)

{
  CustomServer server;
  
  CustomServer::CustomServer(&server,60000);
  blcl::net::server_interface<MsgType>::start(&server.super_server_interface<MsgType>);
  do {
    blcl::net::server_interface<MsgType>::update
              (&server.super_server_interface<MsgType>,0xffffffffffffffff,true);
  } while( true );
}

Assistant:

int main() {
    CustomServer server(60000);
    server.start();

    while (1) {
        server.update();
    }

    return 0;
}